

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O2

bool __thiscall QXmlUtils::isEncName(QXmlUtils *this,QStringView encName)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QStringView QVar7;
  QStringView encName_local;
  
  encName_local.m_data = (storage_type_conflict *)encName.m_size;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  encName_local.m_size = (qsizetype)this;
  if ((this == (QXmlUtils *)0x0) || (0x19 < ((ushort)*encName_local.m_data & 0xffffffdf) - 0x41)) {
    bVar6 = false;
  }
  else {
    QVar7 = QStringView::mid(&encName_local,1,-1);
    for (lVar5 = 0; bVar6 = QVar7.m_size * 2 == lVar5, !bVar6; lVar5 = lVar5 + 2) {
      uVar1 = *(ushort *)((long)QVar7.m_data + lVar5);
      bVar3 = QtMiscUtils::isAsciiLetterOrNumber((uint)uVar1);
      if ((!bVar3) &&
         ((uVar4 = uVar1 - 0x2d, 0x32 < uVar4 ||
          ((0x4000000000003U >> ((ulong)uVar4 & 0x3f) & 1) == 0)))) break;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QXmlUtils::isEncName(QStringView encName)
{
    // Valid encoding names are given by "[A-Za-z][A-Za-z0-9._\\-]*"
    if (encName.isEmpty())
        return false;
    const auto first = encName.front().unicode();
    if (!(isAsciiLower(first) || isAsciiUpper(first)))
        return false;
    for (QChar ch : encName.mid(1)) {
        const auto cp = ch.unicode();
        if (isAsciiLetterOrNumber(cp) || cp == '.' || cp == '_' || cp == '-')
            continue;
        return false;
    }
    return true;
}